

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_ctype_alnum(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte *pbVar1;
  ushort **ppuVar2;
  jx9_value *pObj;
  byte *pbVar3;
  int nLen;
  int local_1c;
  
  if (0 < nArg) {
    pbVar1 = (byte *)jx9_value_to_string(*apArg,&local_1c);
    if (0 < (long)local_1c) {
      pbVar3 = pbVar1 + local_1c;
      ppuVar2 = __ctype_b_loc();
      do {
        if (((*ppuVar2)[*pbVar1] & 8) == 0) goto LAB_00132bc9;
        pbVar1 = pbVar1 + 1;
      } while (pbVar1 < pbVar3);
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      (pObj->x).rVal = 4.94065645841247e-324;
      goto LAB_00132bdc;
    }
  }
LAB_00132bc9:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_00132bdc:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_ctype_alnum(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn  = (const unsigned char *)jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* If we reach the end of the string, then the test succeeded. */
			jx9_result_bool(pCtx, 1);
			return JX9_OK;
		}
		if( !SyisAlphaNum(zIn[0]) ){
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	/* The test failed, return FALSE */
	jx9_result_bool(pCtx, 0);
	return JX9_OK;
}